

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  undefined8 uVar1;
  int iVar2;
  float fVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  cbtQuantizedBvhNode *aabbMin2;
  int iVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar19 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  cbtVector3 cVar31;
  cbtVector3 cVar32;
  cbtScalar param;
  cbtVector3 *local_d8;
  cbtVector3 *local_d0;
  unsigned_short quantizedQueryAabbMax [3];
  unsigned_short quantizedQueryAabbMin [3];
  cbtVector3 local_b8;
  undefined8 local_a8;
  float local_a0;
  undefined4 uStack_9c;
  cbtNodeOverlapCallback *local_98;
  cbtVector3 *local_90;
  undefined8 local_88;
  uint local_80;
  undefined1 local_78 [16];
  cbtVector3 rayDirection;
  cbtVector3 local_58;
  cbtVector3 local_48;
  undefined1 auVar12 [16];
  
  auVar25 = in_ZMM1._8_56_;
  auVar19 = in_ZMM0._8_56_;
  uVar10 = (ulong)startNodeIndex;
  aabbMin2 = (this->m_quantizedContiguousNodes).m_data + uVar10;
  local_d8 = aabbMin;
  local_d0 = aabbMax;
  local_98 = nodeCallback;
  cVar31 = ::operator-(rayTarget,raySource);
  auVar20._0_8_ = cVar31.m_floats._8_8_;
  auVar20._8_56_ = auVar25;
  auVar16._0_8_ = cVar31.m_floats._0_8_;
  auVar16._8_56_ = auVar19;
  rayDirection.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar20._0_16_);
  auVar19 = ZEXT856(rayDirection.m_floats._8_8_);
  cbtVector3::normalize(&rayDirection);
  cVar32 = ::operator-(rayTarget,raySource);
  cVar31 = rayDirection;
  auVar21._0_8_ = cVar32.m_floats._8_8_;
  auVar21._8_56_ = auVar25;
  auVar22._0_8_ = cVar32.m_floats._0_8_;
  auVar22._8_56_ = auVar19;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = rayDirection.m_floats[0];
  auVar26._4_4_ = rayDirection.m_floats[1];
  rayDirection.m_floats[2] = cVar31.m_floats[2];
  auVar29._0_4_ = cVar31.m_floats[0] * cVar32.m_floats[0];
  auVar29._4_4_ = cVar31.m_floats[1] * cVar32.m_floats[1];
  auVar29._8_4_ = auVar19._0_4_ * 0.0;
  auVar29._12_4_ = auVar19._4_4_ * 0.0;
  auVar13 = vmovshdup_avx(auVar29);
  auVar13 = vfmadd231ss_fma(auVar13,auVar26,auVar22._0_16_);
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  uVar4 = vcmpps_avx512vl(auVar26,ZEXT416(0) << 0x20,0);
  local_78 = vfmadd231ss_fma(auVar13,ZEXT416((uint)rayDirection.m_floats[2]),auVar21._0_16_);
  auVar13 = vdivps_avx(auVar14,auVar26);
  auVar11 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
  bVar6 = (bool)((byte)uVar4 & 1);
  auVar12._0_4_ = (uint)bVar6 * auVar11._0_4_ | (uint)!bVar6 * auVar13._0_4_;
  bVar6 = (bool)((byte)(uVar4 >> 1) & 1);
  auVar12._4_4_ = (uint)bVar6 * auVar11._4_4_ | (uint)!bVar6 * auVar13._4_4_;
  bVar6 = (bool)((byte)(uVar4 >> 2) & 1);
  auVar12._8_4_ = (uint)bVar6 * auVar11._8_4_ | (uint)!bVar6 * auVar13._8_4_;
  bVar6 = (bool)((byte)(uVar4 >> 3) & 1);
  auVar12._12_4_ = (uint)bVar6 * auVar11._12_4_ | (uint)!bVar6 * auVar13._12_4_;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)rayDirection.m_floats[2]),ZEXT816(0) << 0x20,0);
  bVar6 = (bool)((byte)uVar5 & 1);
  rayDirection.m_floats[2] =
       (cbtScalar)((uint)bVar6 * 0x5d5e0b6b + (uint)!bVar6 * (int)(1.0 / rayDirection.m_floats[2]));
  uVar5 = vmovlps_avx(auVar12);
  auVar13 = vcmpps_avx(auVar12,ZEXT416(0) << 0x20,1);
  auVar11._8_4_ = 1;
  auVar11._0_8_ = 0x100000001;
  auVar11._12_4_ = 1;
  auVar13 = vandps_avx512vl(auVar13,auVar11);
  rayDirection.m_floats[3] = cVar31.m_floats[3];
  rayDirection.m_floats[0] = (cbtScalar)(int)uVar5;
  rayDirection.m_floats[1] = (cbtScalar)(int)((ulong)uVar5 >> 0x20);
  local_88 = vmovlps_avx(auVar13);
  local_80 = (uint)(rayDirection.m_floats[2] < 0.0);
  local_48.m_floats._0_8_ = *(undefined8 *)raySource->m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)(raySource->m_floats + 2);
  local_58.m_floats._0_8_ = *(undefined8 *)raySource->m_floats;
  local_58.m_floats._8_8_ = *(undefined8 *)(raySource->m_floats + 2);
  local_90 = raySource;
  cbtVector3::setMin(&local_48,rayTarget);
  cbtVector3::setMax(&local_58,rayTarget);
  auVar13._0_4_ = (float)*(undefined8 *)local_d8->m_floats + local_48.m_floats[0];
  auVar13._4_4_ = (float)((ulong)*(undefined8 *)local_d8->m_floats >> 0x20) + local_48.m_floats[1];
  auVar13._8_8_ = 0;
  auVar22 = ZEXT864((ulong)local_58.m_floats._0_8_);
  local_48.m_floats._0_8_ = vmovlps_avx(auVar13);
  local_48.m_floats[2] = local_d8->m_floats[2] + local_48.m_floats[2];
  auVar15._0_4_ = (float)*(undefined8 *)local_d0->m_floats + local_58.m_floats[0];
  auVar15._4_4_ = (float)((ulong)*(undefined8 *)local_d0->m_floats >> 0x20) + local_58.m_floats[1];
  auVar15._8_8_ = 0;
  local_58.m_floats._0_8_ = vmovlps_avx(auVar15);
  fVar3 = local_d0->m_floats[2] + local_58.m_floats[2];
  auVar16 = ZEXT464((uint)fVar3);
  local_58.m_floats[2] = fVar3;
  iVar8 = 0;
  quantizeWithClamp(this,quantizedQueryAabbMin,&local_48,0);
  quantizeWithClamp(this,quantizedQueryAabbMax,&local_58,1);
  do {
    iVar9 = (int)uVar10;
    if (endNodeIndex <= iVar9) {
      if (maxIterations < iVar8) {
        maxIterations = iVar8;
      }
      return;
    }
    param = 1.0;
    uVar7 = testQuantizedAabbAgainstQuantizedAabb
                      (quantizedQueryAabbMin,quantizedQueryAabbMax,aabbMin2->m_quantizedAabbMin,
                       aabbMin2->m_quantizedAabbMax);
    auVar25 = auVar22._8_56_;
    auVar19 = auVar16._8_56_;
    iVar2 = aabbMin2->m_escapeIndexOrTriangleIndex;
    if (uVar7 == 0) {
      bVar6 = false;
LAB_00dddfd9:
      if ((-1 < iVar2) || (bVar6 != false)) goto LAB_00dddff2;
      uVar7 = iVar9 - aabbMin2->m_escapeIndexOrTriangleIndex;
      aabbMin2 = aabbMin2 + -(long)aabbMin2->m_escapeIndexOrTriangleIndex;
    }
    else {
      cVar31 = unQuantize(this,aabbMin2->m_quantizedAabbMin);
      auVar23._0_8_ = cVar31.m_floats._8_8_;
      auVar23._8_56_ = auVar25;
      auVar17._0_8_ = cVar31.m_floats._0_8_;
      auVar17._8_56_ = auVar19;
      local_b8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar23._0_16_);
      auVar19 = ZEXT856(local_b8.m_floats._8_8_);
      cVar32 = unQuantize(this,aabbMin2->m_quantizedAabbMax);
      cVar31.m_floats = local_b8.m_floats;
      auVar24._0_8_ = cVar32.m_floats._8_8_;
      auVar24._8_56_ = auVar25;
      auVar18._0_8_ = cVar32.m_floats._0_8_;
      auVar18._8_56_ = auVar19;
      uVar5 = vmovlps_avx(auVar24._0_16_);
      auVar30._8_8_ = 0;
      auVar30._0_4_ = local_b8.m_floats[0];
      auVar30._4_4_ = local_b8.m_floats[1];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)local_d0->m_floats;
      auVar13 = vsubps_avx(auVar30,auVar27);
      uVar1 = vmovlps_avx(auVar13);
      local_b8.m_floats[2] = cVar31.m_floats[2];
      local_b8.m_floats[3] = cVar31.m_floats[3];
      local_b8.m_floats[2] = local_b8.m_floats[2] - local_d0->m_floats[2];
      local_b8.m_floats[0] = (cbtScalar)(int)uVar1;
      local_b8.m_floats[1] = (cbtScalar)(int)((ulong)uVar1 >> 0x20);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)local_d8->m_floats;
      auVar13 = vsubps_avx(auVar18._0_16_,auVar28);
      local_a8 = vmovlps_avx(auVar13);
      auVar22 = ZEXT1664(local_78);
      _local_a0 = CONCAT44((int)((ulong)uVar5 >> 0x20),cVar32.m_floats[2] - local_d8->m_floats[2]);
      auVar16 = ZEXT1264(ZEXT812(0));
      bVar6 = cbtRayAabb2(local_90,&rayDirection,(uint *)&local_88,&local_b8,&param,0.0,
                          local_78._0_4_);
      if ((iVar2 < 0) || (!bVar6)) goto LAB_00dddfd9;
      (*local_98->_vptr_cbtNodeOverlapCallback[2])
                (local_98,(ulong)(uint)(aabbMin2->m_escapeIndexOrTriangleIndex >> 0x15),
                 (ulong)(aabbMin2->m_escapeIndexOrTriangleIndex & 0x1fffff));
LAB_00dddff2:
      aabbMin2 = aabbMin2 + 1;
      uVar7 = iVar9 + 1;
    }
    uVar10 = (ulong)uVar7;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void cbtQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(m_useQuantization);

	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;

	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	cbtScalar lambda_max = 1.0;

#ifdef RAYAABB2
	cbtVector3 rayDirection = (rayTarget - raySource);
	rayDirection.normalize();
	lambda_max = rayDirection.dot(rayTarget - raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = {rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	cbtVector3 rayAabbMin = raySource;
	cbtVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin, rayAabbMin, 0);
	quantizeWithClamp(quantizedQueryAabbMax, rayAabbMax, 1);

	while (curIndex < endNodeIndex)
	{
//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern cbtIDebugDraw* debugDrawerPtr;
		if (curIndex == drawPatch)
		{
			cbtVector3 aabbMin, aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			cbtVector3 color(1, 0, 0);
			debugDrawerPtr->drawAabb(aabbMin, aabbMax, color);
		}
#endif  //VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		cbtAssert(walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		cbtScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, rootNode->m_quantizedAabbMin, rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			cbtVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			cbtVector3 normal;
#if 0
			bool ra2 = cbtRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = cbtRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("cbtRayAabb2");
			rayBoxOverlap = cbtRayAabb2(raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);

#else
			rayBoxOverlap = true;  //cbtRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}

		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(), rootNode->getTriangleIndex());
		}

		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}